

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyBalance.c
# Opt level: O0

int Ivy_NodeCompareLevelsDecrease(Ivy_Obj_t **pp1,Ivy_Obj_t **pp2)

{
  uint uVar1;
  int iVar2;
  Ivy_Obj_t *pIVar3;
  int Diff;
  Ivy_Obj_t **pp2_local;
  Ivy_Obj_t **pp1_local;
  
  pIVar3 = Ivy_Regular(*pp1);
  uVar1 = *(uint *)&pIVar3->field_0x8;
  pIVar3 = Ivy_Regular(*pp2);
  iVar2 = (uVar1 >> 0xb) - (*(uint *)&pIVar3->field_0x8 >> 0xb);
  if (iVar2 < 1) {
    if (iVar2 < 0) {
      pp1_local._4_4_ = 1;
    }
    else {
      pIVar3 = Ivy_Regular(*pp1);
      iVar2 = pIVar3->Id;
      pIVar3 = Ivy_Regular(*pp2);
      iVar2 = iVar2 - pIVar3->Id;
      if (iVar2 < 1) {
        if (iVar2 < 0) {
          pp1_local._4_4_ = 1;
        }
        else {
          pp1_local._4_4_ = 0;
        }
      }
      else {
        pp1_local._4_4_ = -1;
      }
    }
  }
  else {
    pp1_local._4_4_ = -1;
  }
  return pp1_local._4_4_;
}

Assistant:

int Ivy_NodeCompareLevelsDecrease( Ivy_Obj_t ** pp1, Ivy_Obj_t ** pp2 )
{
    int Diff = Ivy_Regular(*pp1)->Level - Ivy_Regular(*pp2)->Level;
    if ( Diff > 0 )
        return -1;
    if ( Diff < 0 ) 
        return 1;
    Diff = Ivy_Regular(*pp1)->Id - Ivy_Regular(*pp2)->Id;
    if ( Diff > 0 )
        return -1;
    if ( Diff < 0 ) 
        return 1;
    return 0; 
}